

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall
QGraphicsScenePrivate::cancelGesturesForChildren(QGraphicsScenePrivate *this,QGesture *original)

{
  QHash<QGesture_*,_QGraphicsObject_*> *this_00;
  QGesture **ppQVar1;
  Data *this_01;
  long lVar2;
  Span *pSVar3;
  Entry *pEVar4;
  QGesture *gesture;
  long lVar5;
  long *plVar6;
  QGraphicsItemPrivate *pQVar7;
  int *piVar8;
  bool bVar9;
  GestureType GVar10;
  Node<QGesture_*,_QGraphicsObject_*> *pNVar11;
  Data<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_> *d;
  QGraphicsObject *pQVar12;
  QGraphicsObject *pQVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  QGesture **ppQVar17;
  QGraphicsItem **item;
  undefined8 *puVar18;
  QGraphicsItem *child;
  QGraphicsItem *pQVar19;
  undefined8 *puVar20;
  size_t sVar21;
  uint uVar22;
  QGestureManager *this_02;
  Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *pDVar23;
  QHash<QGesture_*,_QHashDummyValue> QVar24;
  long in_FS_OFFSET;
  byte bVar25;
  piter it;
  QGestureEvent ev;
  QGestureEvent ev_1;
  QArrayData *local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined1 *local_118;
  undefined1 local_108 [12];
  char cStack_fc;
  Data *local_f8;
  QGesture **ppQStack_f0;
  undefined1 *local_e8;
  QWidget *pQStack_e0;
  QMap<Qt::GestureType,_bool> local_d8;
  QMap<Qt::GestureType,_QWidget_*> QStack_d0;
  QList<QGesture_*> local_c8;
  QHash<QGesture_*,_QHashDummyValue> local_a8;
  QHash<QGesture_*,_QHashDummyValue> local_a0;
  QHash<QGesture_*,_QHashDummyValue> local_98;
  QGesture *local_90;
  undefined1 local_88 [12];
  char cStack_7c;
  Data *local_78;
  QGesture **ppQStack_70;
  undefined1 *local_68;
  QWidget *pQStack_60;
  QMap<Qt::GestureType,_bool> local_58;
  QMap<Qt::GestureType,_QWidget_*> QStack_50;
  undefined2 local_40;
  long local_38;
  
  bVar25 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (this->gestureTargets).d;
  local_90 = original;
  if (((this_01 == (Data *)0x0) ||
      (pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>::
                 findNode<QGesture*>((Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>> *)this_01
                                     ,&local_90),
      pNVar11 == (Node<QGesture_*,_QGraphicsObject_*> *)0x0)) ||
     (pQVar19 = &pNVar11->value->super_QGraphicsItem, pNVar11->value == (QGraphicsObject *)0x0))
  goto LAB_0060ef0e;
  this_00 = &this->gestureTargets;
  local_98.d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
  d = this_00->d;
  if (d == (Data<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_> *)0x0) {
    d = (Data<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_> *)0x0;
    uVar16 = 0;
LAB_0060e7a7:
    if (uVar16 != 0 || d != (Data<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_> *)0x0)
    goto LAB_0060e7b3;
  }
  else {
    if (1 < (uint)(d->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      d = QHashPrivate::Data<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_>::detached(d);
      this_00->d = d;
    }
    if (d->spans->offsets[0] == 0xff) {
      uVar14 = 1;
      do {
        uVar16 = uVar14;
        if (d->numBuckets == uVar16) {
          d = (Data<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_> *)0x0;
          uVar16 = 0;
          break;
        }
        uVar14 = uVar16 + 1;
      } while (d->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f] == 0xff);
      goto LAB_0060e7a7;
    }
    uVar16 = 0;
LAB_0060e7b3:
    do {
      uVar14 = uVar16 >> 7;
      uVar22 = (uint)uVar16 & 0x7f;
      lVar2 = *(long *)(d->spans[uVar14].entries[d->spans[uVar14].offsets[uVar22]].storage.data + 8)
      ;
      child = (QGraphicsItem *)(lVar2 + 0x10);
      if (lVar2 == 0) {
        child = (QGraphicsItem *)0x0;
      }
      if ((child != pQVar19) && (bVar9 = QGraphicsItem::isAncestorOf(pQVar19,child), bVar9)) {
        pSVar3 = d->spans;
        pEVar4 = pSVar3[uVar14].entries;
        *(undefined4 *)
         (*(long *)(*(long *)pEVar4[pSVar3[uVar14].offsets[uVar22]].storage.data + 8) + 0x7c) = 4;
        local_88._0_8_ = *(undefined8 *)pEVar4[pSVar3[uVar14].offsets[uVar22]].storage.data;
        QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                  ((QHash<QGesture*,QHashDummyValue> *)&local_98,(QGesture **)local_88,
                   (QHashDummyValue *)local_108);
      }
      do {
        if (d->numBuckets - 1 == uVar16) {
          uVar16 = 0;
          d = (Data<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_> *)0x0;
          break;
        }
        uVar16 = uVar16 + 1;
      } while (d->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f] == 0xff);
    } while ((uVar16 != 0) || (d != (Data<QHashPrivate::Node<QGesture_*,_QGraphicsObject_*>_> *)0x0)
            );
  }
  local_a0.d = local_98.d;
  if (local_98.d == (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0) {
    this_02 = QApplicationPrivate::self->gestureManager;
    uVar16 = 0;
    QVar24.d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
LAB_0060ee4a:
    if (uVar16 != 0 || QVar24.d != (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0)
    goto LAB_0060ee56;
  }
  else {
    if (((local_98.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == -1) goto LAB_0060e8e6;
    LOCK();
    ((local_98.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
         ((local_98.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    while (local_a0.d != (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0) {
LAB_0060e8e6:
      if ((local_a0.d)->size == 0) break;
      local_a8.d = (Data *)0x0;
      if (1 < (uint)((local_a0.d)->ref).atomic._q_value.super___atomic_base<int>._M_i) {
        local_a0.d = QHashPrivate::Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::detached
                               (local_a0.d);
      }
      QVar24.d = local_a0.d;
      if ((local_a0.d)->spans->offsets[0] == 0xff) {
        uVar16 = 1;
        do {
          sVar21 = uVar16;
          if ((local_a0.d)->numBuckets == sVar21) {
            sVar21 = 0;
            QVar24.d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
            break;
          }
          uVar16 = sVar21 + 1;
        } while ((local_a0.d)->spans[sVar21 >> 7].offsets[(uint)sVar21 & 0x7f] == 0xff);
        if (QVar24.d != (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0 || sVar21 != 0
           ) goto LAB_0060e96d;
        pQVar13 = (QGraphicsObject *)0x0;
      }
      else {
        sVar21 = 0;
LAB_0060e96d:
        it.bucket = sVar21;
        it.d = QVar24.d;
        pQVar13 = (QGraphicsObject *)0x0;
        do {
          uVar14 = it.bucket;
          pDVar23 = it.d;
          uVar16 = uVar14 >> 7;
          uVar22 = (uint)it.bucket & 0x7f;
          if ((this_00->d == (Data *)0x0) ||
             (pNVar11 = QHashPrivate::Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>>::
                        findNode<QGesture*>((Data<QHashPrivate::Node<QGesture*,QGraphicsObject*>> *)
                                            this_00->d,
                                            (QGesture **)
                                            (pDVar23->spans[uVar16].entries +
                                            pDVar23->spans[uVar16].offsets[uVar22])),
             pNVar11 == (Node<QGesture_*,_QGraphicsObject_*> *)0x0)) {
            pQVar12 = (QGraphicsObject *)0x0;
          }
          else {
            pQVar12 = pNVar11->value;
          }
          if (pQVar13 == (QGraphicsObject *)0x0) {
            pQVar13 = pQVar12;
          }
          if (pQVar13 == pQVar12) {
            local_88._0_8_ =
                 *(undefined8 *)
                  pDVar23->spans[uVar16].entries[pDVar23->spans[uVar16].offsets[uVar22]].storage.
                  data;
            QHash<QGesture*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                      ((QHash<QGesture*,QHashDummyValue> *)&local_a8,(QGesture **)local_88,
                       (QHashDummyValue *)local_108);
            it = (piter)QHash<QGesture_*,_QHashDummyValue>::erase(&local_a0,(const_iterator)it);
          }
          else {
            do {
              if (pDVar23->numBuckets - 1 == uVar14) {
                it = (piter)ZEXT816(0);
                break;
              }
              uVar14 = uVar14 + 1;
              it.bucket = uVar14;
              it.d = pDVar23;
            } while (pDVar23->spans[uVar14 >> 7].offsets[(uint)uVar14 & 0x7f] == 0xff);
          }
        } while ((it.d != (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0) ||
                (it.bucket != 0));
      }
      local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_c8.d.ptr = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
      QSet<QGesture_*>::values(&local_c8,(QSet<QGesture_*> *)&local_a8);
      local_d8.d.d.ptr =
           (QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_bool,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_bool>_>_>_>_>
            )&DAT_aaaaaaaaaaaaaaaa;
      QStack_d0.d.d.ptr =
           (QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_>
            )&DAT_aaaaaaaaaaaaaaaa;
      local_e8 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_e0 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      ppQStack_f0 = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
      local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffff00 = &DAT_aaaaaaaaaaaaaaaa;
      QGestureEvent::QGestureEvent((QGestureEvent *)local_108,&local_c8);
      pQVar19 = &pQVar13->super_QGraphicsItem;
      if (pQVar13 == (QGraphicsObject *)0x0) {
        pQVar19 = (QGraphicsItem *)0x0;
      }
      sendEvent(this,pQVar19,(QEvent *)local_108);
      if ((cStack_fc == '\0') && ((undefined1 *)local_c8.d.size != (undefined1 *)0x0)) {
        ppQVar1 = local_c8.d.ptr + local_c8.d.size;
        ppQVar17 = local_c8.d.ptr;
        do {
          gesture = *ppQVar17;
          bVar9 = QGestureEvent::isAccepted((QGestureEvent *)local_108,gesture);
          if ((!bVar9) && (bVar9 = QGesture::hasHotSpot(gesture), bVar9)) {
            local_118 = &DAT_aaaaaaaaaaaaaaaa;
            local_128 = 0xaaaaaaaa;
            uStack_124 = 0xaaaaaaaa;
            uStack_120 = 0xaaaaaaaa;
            uStack_11c = 0xaaaaaaaa;
            lVar2 = *(long *)&gesture->field_0x8;
            lVar5 = *(long *)&this->field_0x8;
            puVar18 = &DAT_006f3c18;
            puVar20 = (undefined8 *)local_88;
            for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
              *puVar20 = *puVar18;
              puVar18 = puVar18 + (ulong)bVar25 * -2 + 1;
              puVar20 = puVar20 + (ulong)bVar25 * -2 + 1;
            }
            local_40 = 0;
            plVar6 = *(long **)(*(long *)(lVar5 + 8) + 0x88);
            (**(code **)(*plVar6 + 0x68))(&local_128,plVar6,lVar2 + 0x90,1,1,local_88);
            if (local_118 != (undefined1 *)0x0) {
              puVar18 = (undefined8 *)CONCAT44(uStack_11c,uStack_120);
              puVar20 = puVar18 + (long)local_118;
              do {
                while (pQVar13 = QGraphicsItem::toGraphicsObject((QGraphicsItem *)*puVar18),
                      pQVar13 == (QGraphicsObject *)0x0) {
LAB_0060ecff:
                  puVar18 = puVar18 + 1;
                  if (puVar18 == puVar20) goto LAB_0060ed0c;
                }
                pQVar7 = (pQVar13->super_QGraphicsItem).d_ptr.d;
                GVar10 = QGesture::gestureType(gesture);
                local_88._0_4_ = GVar10;
                bVar9 = QMap<Qt::GestureType,_QFlags<Qt::GestureFlag>_>::contains
                                  (&pQVar7->gestureContext,(GestureType *)local_88);
                if (!bVar9) goto LAB_0060ecff;
                local_148 = (QArrayData *)0x0;
                uStack_140 = 0;
                local_138 = 0;
                local_88._0_8_ = gesture;
                QtPrivate::QPodArrayOps<QGesture*>::emplace<QGesture*&>
                          ((QPodArrayOps<QGesture*> *)&local_148,0,(QGesture **)local_88);
                QList<QGesture_*>::end((QList<QGesture_*> *)&local_148);
                local_58.d.d.ptr =
                     (QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_bool,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_bool>_>_>_>_>
                      )&DAT_aaaaaaaaaaaaaaaa;
                QStack_50.d.d.ptr =
                     (QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::GestureType,_QWidget_*,_std::less<Qt::GestureType>,_std::allocator<std::pair<const_Qt::GestureType,_QWidget_*>_>_>_>_>
                      )&DAT_aaaaaaaaaaaaaaaa;
                local_68 = &DAT_aaaaaaaaaaaaaaaa;
                pQStack_60 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
                local_78 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                ppQStack_70 = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
                local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                stack0xffffffffffffff80 = &DAT_aaaaaaaaaaaaaaaa;
                QGestureEvent::QGestureEvent
                          ((QGestureEvent *)local_88,(QList<QGesture_*> *)&local_148);
                sendEvent(this,&pQVar13->super_QGraphicsItem,(QEvent *)local_88);
                bVar9 = true;
                if (cStack_7c == '\0') {
                  bVar9 = QGestureEvent::isAccepted((QGestureEvent *)local_88,gesture);
                }
                QGestureEvent::~QGestureEvent((QGestureEvent *)local_88);
                if (local_148 != (QArrayData *)0x0) {
                  LOCK();
                  (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
                       (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(local_148,8,0x10);
                  }
                }
                puVar18 = puVar18 + 1;
              } while (bVar9 == false && puVar18 != puVar20);
            }
LAB_0060ed0c:
            piVar8 = (int *)CONCAT44(uStack_124,local_128);
            if (piVar8 != (int *)0x0) {
              LOCK();
              *piVar8 = *piVar8 + -1;
              UNLOCK();
              if (*piVar8 == 0) {
                QArrayData::deallocate((QArrayData *)CONCAT44(uStack_124,local_128),8,0x10);
              }
            }
          }
          ppQVar17 = ppQVar17 + 1;
        } while (ppQVar17 != ppQVar1);
      }
      QGestureEvent::~QGestureEvent((QGestureEvent *)local_108);
      if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,8,0x10);
        }
      }
      QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_a8);
    }
    this_02 = QApplicationPrivate::self->gestureManager;
    if (local_98.d == (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0) {
      uVar16 = 0;
      QVar24.d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
      goto LAB_0060ee4a;
    }
    if (1 < (uint)((local_98.d)->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_98.d = QHashPrivate::Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_>::detached
                             (local_98.d);
    }
    QVar24.d = local_98.d;
    if ((local_98.d)->spans->offsets[0] == 0xff) {
      uVar14 = 1;
      do {
        uVar16 = uVar14;
        if ((local_98.d)->numBuckets == uVar16) {
          uVar16 = 0;
          QVar24.d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
          break;
        }
        uVar14 = uVar16 + 1;
      } while ((local_98.d)->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f] == 0xff);
      goto LAB_0060ee4a;
    }
    uVar16 = 0;
LAB_0060ee56:
    do {
      lVar2 = (uVar16 >> 3 & 0xfffffffffffffff0) * 9;
      uVar14 = (ulong)((uint)uVar16 & 0x7f);
      QGestureManager::recycle
                ((QGestureManager *)this_02,
                 *(QGesture **)
                  (*(long *)((QVar24.d)->spans->offsets + lVar2 + 0x80) +
                  (ulong)(QVar24.d)->spans->offsets[uVar14 + lVar2] * 8));
      QHash<QGesture*,QGraphicsObject*>::removeImpl<QGesture*>
                ((QHash<QGesture*,QGraphicsObject*> *)this_00,
                 (QGesture **)
                 ((ulong)(QVar24.d)->spans->offsets[uVar14 + lVar2] * 8 +
                 *(long *)((QVar24.d)->spans->offsets + lVar2 + 0x80)));
      do {
        if ((QVar24.d)->numBuckets - 1 == uVar16) {
          uVar16 = 0;
          QVar24.d = (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0;
          break;
        }
        uVar16 = uVar16 + 1;
      } while ((QVar24.d)->spans[uVar16 >> 7].offsets[(uint)uVar16 & 0x7f] == 0xff);
    } while ((uVar16 != 0) ||
            (QVar24.d != (Data<QHashPrivate::Node<QGesture_*,_QHashDummyValue>_> *)0x0));
  }
  QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_a0);
  QHash<QGesture_*,_QHashDummyValue>::~QHash(&local_98);
LAB_0060ef0e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::cancelGesturesForChildren(QGesture *original)
{
    Q_ASSERT(original);
    QGraphicsItem *originalItem = gestureTargets.value(original);
    if (originalItem == nullptr) // we only act on accepted gestures, which implies it has a target.
        return;

    // iterate over all active gestures and for each find the owner
    // if the owner is part of our sub-hierarchy, cancel it.

    QSet<QGesture *> canceledGestures;
    QHash<QGesture *, QGraphicsObject *>::Iterator iter = gestureTargets.begin();
    while (iter != gestureTargets.end()) {
        QGraphicsObject *item = iter.value();
        // note that we don't touch the gestures for our originalItem
        if (item != originalItem && originalItem->isAncestorOf(item)) {
            DEBUG() << "  found a gesture to cancel" << iter.key();
            iter.key()->d_func()->state = Qt::GestureCanceled;
            canceledGestures << iter.key();
        }
        ++iter;
    }

    // sort them per target item by cherry picking from almostCanceledGestures and delivering
    QSet<QGesture *> almostCanceledGestures = canceledGestures;
    QSet<QGesture *>::Iterator setIter;
    while (!almostCanceledGestures.isEmpty()) {
        QGraphicsObject *target = nullptr;
        QSet<QGesture*> gestures;
        setIter = almostCanceledGestures.begin();
        // sort per target item
        while (setIter != almostCanceledGestures.end()) {
            QGraphicsObject *item = gestureTargets.value(*setIter);
            if (target == nullptr)
                target = item;
            if (target == item) {
                gestures << *setIter;
                setIter = almostCanceledGestures.erase(setIter);
            } else {
                ++setIter;
            }
        }
        Q_ASSERT(target);

        const QList<QGesture *> list = gestures.values();
        QGestureEvent ev(list);
        sendEvent(target, &ev);

        if (!ev.isAccepted()) {
            for (QGesture *g : list) {

                if (ev.isAccepted(g))
                    continue;

                if (!g->hasHotSpot())
                    continue;

                const QList<QGraphicsItem *> items = itemsAtPosition(QPoint(), g->d_func()->sceneHotSpot, nullptr);
                for (const auto &item : items) {
                    QGraphicsObject *object = item->toGraphicsObject();
                    if (!object)
                        continue;
                    QGraphicsItemPrivate *d = object->QGraphicsItem::d_func();
                    if (d->gestureContext.contains(g->gestureType())) {
                        QList<QGesture *> list;
                        list << g;
                        QGestureEvent ev(list);
                        sendEvent(object, &ev);
                        if (ev.isAccepted() || ev.isAccepted(g))
                            break; // successfully delivered
                    }
                }
            }
        }
    }

    QGestureManager *gestureManager = QApplicationPrivate::instance()->gestureManager;
    Q_ASSERT(gestureManager); // it would be very odd if we got called without a manager.
    for (setIter = canceledGestures.begin(); setIter != canceledGestures.end(); ++setIter) {
        gestureManager->recycle(*setIter);
        gestureTargets.remove(*setIter);
    }
}